

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::INCR(Sequencer *this,unsigned_short instruction)

{
  unsigned_short a;
  unsigned_short word;
  pair<unsigned_short,_unsigned_short> pVar1;
  ostream *poVar2;
  ushort address;
  
  address = instruction & 0x3ff;
  poVar2 = std::operator<<((ostream *)&std::cout,"INCR");
  poVar2 = std::operator<<(poVar2," ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,address);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  a = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,address,0);
  word = 1;
  if (a != 0x7fff) {
    pVar1 = AddWords(a,1);
    word = pVar1.first;
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,word);
  return;
}

Assistant:

void egc::Sequencer::INCR (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "INCR" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);

    unsigned short sign = mk & 040000u;

    if (mk == 077777u)
    {
        mk = 000001u;
    }
    else
    {
        mk = AddWords(mk, 000001u).first;
    }

    m_Memory->Write(k, mk);
}